

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,6u>::small_vector_base<6u>(void)

{
  size_ty sVar1;
  allocator_interface<std::allocator<mp::LinearExpr::Term>_> *this;
  cptr pTVar2;
  cptr first;
  ptr in_stack_ffffffffffffff98;
  cptr in_stack_ffffffffffffffa0;
  ptr in_stack_ffffffffffffffa8;
  Term *in_stack_ffffffffffffffb0;
  Term *in_stack_ffffffffffffffb8;
  allocator_interface<std::allocator<mp::LinearExpr::Term>_> *in_stack_ffffffffffffffc0;
  
  allocator_interface<std::allocator<mp::LinearExpr::Term>_>::allocator_interface
            ((allocator_interface<std::allocator<mp::LinearExpr::Term>_> *)in_stack_ffffffffffffffb0
             ,(allocator_interface<std::allocator<mp::LinearExpr::Term>_> *)
              in_stack_ffffffffffffffa8);
  sVar1 = small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::get_size
                    ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c4bc);
  if (sVar1 < 7) {
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::set_to_inline_storage
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
               in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 =
         small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::begin_ptr
                   ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c594);
    pTVar2 = small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::end_ptr
                       ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
                        in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::data_ptr
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c5b2);
    allocator_interface<std::allocator<mp::LinearExpr::Term>_>::
    uninitialized_copy<const_mp::LinearExpr::Term_*,_true>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,pTVar2)
    ;
  }
  else {
    this = (allocator_interface<std::allocator<mp::LinearExpr::Term>_> *)
           small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::get_size
                     ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c4d7);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::allocation_end_ptr
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
               in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::unchecked_allocate
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
               in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98,(cptr)0x13c4f8);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::set_data_ptr
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::get_size
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c518);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::set_capacity
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
               in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98);
    pTVar2 = small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::begin_ptr
                       ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c52f);
    first = small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::end_ptr
                      ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
                       in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::data_ptr
              ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c54d);
    allocator_interface<std::allocator<mp::LinearExpr::Term>_>::
    uninitialized_copy<const_mp::LinearExpr::Term_*,_true>
              (this,first,pTVar2,in_stack_ffffffffffffffa8);
  }
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::get_size
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)0x13c5d3);
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::set_size
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98);
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (bypass_tag,
                         const small_vector_base<Allocator, I>& other,
                         const MaybeAlloc&... alloc)
        : alloc_interface (other, alloc...)
      {
        if (InlineCapacity < other.get_size ())
        {
          set_data_ptr (unchecked_allocate (other.get_size (), other.allocation_end_ptr ()));
          set_capacity (other.get_size ());

          GCH_TRY
          {
            uninitialized_copy (other.begin_ptr (), other.end_ptr (), data_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }